

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::Kernel::MergePartialFromCodedStream(Kernel *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint32 uVar4;
  int iVar5;
  LinearKernel *this_00;
  ulong extraout_RAX;
  PolyKernel *this_01;
  ulong extraout_RAX_00;
  SigmoidKernel *this_02;
  ulong extraout_RAX_01;
  RBFKernel *this_03;
  ulong extraout_RAX_02;
  char cVar6;
  ulong uVar7;
  int local_3c;
  
  do {
    pbVar2 = input->buffer_;
    uVar4 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar4 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_004d3e2c;
      input->buffer_ = pbVar2 + 1;
      uVar7 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_004d3e2c:
      uVar4 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar4);
      uVar7 = 0;
      if (uVar4 - 1 < 0x7f) {
        uVar7 = 0x100000000;
      }
      uVar7 = uVar4 | uVar7;
    }
    uVar4 = (uint32)uVar7;
    if ((uVar7 & 0x100000000) == 0) goto switchD_004d3e94_default;
    cVar6 = (char)uVar7;
    switch((uint)(uVar7 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar6 != '\n') break;
      if (this->_oneof_case_[0] != 1) {
        clear_kernel(this);
        this->_oneof_case_[0] = 1;
        this_00 = (LinearKernel *)operator_new(0x18);
        LinearKernel::LinearKernel(this_00);
        (this->kernel_).linearkernel_ = this_00;
      }
      MergePartialFromCodedStream();
      uVar7 = extraout_RAX;
LAB_004d3ff7:
      iVar5 = local_3c;
      if ((uVar7 & 1) == 0) goto LAB_004d3e76;
      goto LAB_004d3e78;
    case 2:
      if (cVar6 == '\x12') {
        if (this->_oneof_case_[0] != 2) {
          clear_kernel(this);
          this->_oneof_case_[0] = 2;
          this_03 = (RBFKernel *)operator_new(0x20);
          RBFKernel::RBFKernel(this_03);
          (this->kernel_).rbfkernel_ = this_03;
        }
        MergePartialFromCodedStream();
        uVar7 = extraout_RAX_02;
        goto LAB_004d3ff7;
      }
      break;
    case 3:
      if (cVar6 == '\x1a') {
        if (this->_oneof_case_[0] != 3) {
          clear_kernel(this);
          this->_oneof_case_[0] = 3;
          this_01 = (PolyKernel *)operator_new(0x28);
          PolyKernel::PolyKernel(this_01);
          (this->kernel_).polykernel_ = this_01;
        }
        MergePartialFromCodedStream();
        uVar7 = extraout_RAX_00;
        goto LAB_004d3ff7;
      }
      break;
    case 4:
      if (cVar6 == '\"') {
        if (this->_oneof_case_[0] != 4) {
          clear_kernel(this);
          this->_oneof_case_[0] = 4;
          this_02 = (SigmoidKernel *)operator_new(0x28);
          SigmoidKernel::SigmoidKernel(this_02);
          (this->kernel_).sigmoidkernel_ = this_02;
        }
        MergePartialFromCodedStream();
        uVar7 = extraout_RAX_01;
        goto LAB_004d3ff7;
      }
    }
switchD_004d3e94_default:
    iVar5 = 7;
    if ((uVar4 & 7) != 4 && uVar4 != 0) {
      bVar3 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar4);
      if (bVar3) {
LAB_004d3e76:
        iVar5 = 0;
      }
      else {
        iVar5 = 6;
      }
    }
LAB_004d3e78:
    if (iVar5 != 0) {
      return iVar5 != 6;
    }
  } while( true );
}

Assistant:

bool Kernel::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.Kernel)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.LinearKernel linearKernel = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_linearkernel()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.RBFKernel rbfKernel = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_rbfkernel()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.PolyKernel polyKernel = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_polykernel()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.SigmoidKernel sigmoidKernel = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_sigmoidkernel()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.Kernel)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.Kernel)
  return false;
#undef DO_
}